

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# percent_encode.c
# Opt level: O2

void percent_encode_bs(BinarySink *bs,ptrlen data,char *badchars)

{
  byte val;
  char *pcVar1;
  int __c;
  byte *pbVar2;
  char *p;
  byte *pbVar3;
  
  pbVar3 = (byte *)data.ptr;
  pbVar2 = pbVar3 + data.len;
  do {
    if (pbVar2 <= pbVar3) {
      return;
    }
    val = *pbVar3;
    __c = (int)(char)val;
    if (__c == 0x25 || __c < 0x20) {
LAB_00158f92:
      BinarySink_put_fmt(bs->binarysink_,"%%%02X",(ulong)val);
    }
    else {
      if (badchars != (char *)0x0) {
        pcVar1 = strchr(badchars,__c);
        if (pcVar1 != (char *)0x0) goto LAB_00158f92;
      }
      BinarySink_put_byte(bs->binarysink_,val);
    }
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

void percent_encode_bs(BinarySink *bs, ptrlen data, const char *badchars)
{
    for (const char *p = data.ptr, *e = ptrlen_end(data); p < e; p++) {
        char c = *p;
        if (c == '%' || c < ' ' || (badchars && strchr(badchars, c)))
            put_fmt(bs, "%%%02X", (unsigned char)c);
        else
            put_byte(bs, c);
    }
}